

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

char * mpack_node_utf8_cstr_alloc(mpack_node_t node,size_t maxlen)

{
  uint uVar1;
  char *pcVar2;
  _Bool _Var3;
  char *__dest;
  mpack_tree_error_t p_Var4;
  mpack_error_t mVar5;
  mpack_tree_t *pmVar6;
  mpack_node_data_t *pmVar7;
  ulong count;
  
  pmVar6 = node.tree;
  pmVar7 = node.data;
  if (pmVar6->error != mpack_ok) {
    return (char *)0x0;
  }
  if (maxlen == 0) {
    pmVar6->error = mpack_error_bug;
    p_Var4 = pmVar6->error_fn;
    if (p_Var4 == (mpack_tree_error_t)0x0) {
      return (char *)0x0;
    }
    mVar5 = mpack_error_bug;
    goto LAB_0010a075;
  }
  if (pmVar7->type == mpack_type_str) {
    uVar1 = pmVar7->len;
    count = (ulong)uVar1;
    if (maxlen - 1 < count) {
      pmVar6->error = mpack_error_too_big;
      p_Var4 = pmVar6->error_fn;
      if (p_Var4 == (mpack_tree_error_t)0x0) {
        return (char *)0x0;
      }
      mVar5 = mpack_error_too_big;
      goto LAB_0010a075;
    }
    pcVar2 = pmVar6->data;
    pmVar7 = (pmVar7->value).children;
    _Var3 = mpack_utf8_check_impl((uint8_t *)(pcVar2 + (long)pmVar7),count,false);
    if (_Var3) {
      __dest = (char *)malloc((ulong)(uVar1 + 1));
      if (__dest != (char *)0x0) {
        memcpy(__dest,pcVar2 + (long)pmVar7,count);
        __dest[count] = '\0';
        return __dest;
      }
      pmVar6->error = mpack_error_memory;
      p_Var4 = pmVar6->error_fn;
      if (p_Var4 == (mpack_tree_error_t)0x0) {
        return (char *)0x0;
      }
      mVar5 = mpack_error_memory;
      goto LAB_0010a075;
    }
  }
  pmVar6->error = mpack_error_type;
  p_Var4 = pmVar6->error_fn;
  if (p_Var4 == (mpack_tree_error_t)0x0) {
    return (char *)0x0;
  }
  mVar5 = mpack_error_type;
LAB_0010a075:
  (*p_Var4)(pmVar6,mVar5);
  return (char *)0x0;
}

Assistant:

char* mpack_node_utf8_cstr_alloc(mpack_node_t node, size_t maxlen) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    // make sure maxlen makes sense
    if (maxlen < 1) {
        mpack_break("maxlen is zero; you must have room for at least a null-terminator");
        mpack_node_flag_error(node, mpack_error_bug);
        return NULL;
    }

    if (node.data->type != mpack_type_str) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    if (node.data->len > maxlen - 1) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return NULL;
    }

    if (!mpack_utf8_check_no_null(mpack_node_data_unchecked(node), node.data->len)) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    char* ret = (char*) MPACK_MALLOC((size_t)(node.data->len + 1));
    if (ret == NULL) {
        mpack_node_flag_error(node, mpack_error_memory);
        return NULL;
    }

    mpack_memcpy(ret, mpack_node_data_unchecked(node), node.data->len);
    ret[node.data->len] = '\0';
    return ret;
}